

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_ATC_NAVAIDS_FundamentalParameterData.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,IFF_ATC_NAVAIDS_FundamentalParameterData *this)

{
  ostream *poVar1;
  KINT32 Value;
  KStringStream ss;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"IFF/ATC/NAVAID Fundamental Parameter Data:");
  poVar1 = std::operator<<(poVar1,"\n\tERP:              ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32ERP);
  poVar1 = std::operator<<(poVar1,"\n\tFrequency:        ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32Freq);
  poVar1 = std::operator<<(poVar1,"\n\tPgRF:             ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32PgRF);
  poVar1 = std::operator<<(poVar1,"\n\tPulse Width:      ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32PulseWidth);
  poVar1 = std::operator<<(poVar1,"\n\tBurst Length:     ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\tApplicable Modes: ");
  ENUMS::GetEnumAsStringSystemMode_abi_cxx11_(&local_1c0,(ENUMS *)(ulong)this->m_ui8AppMode,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString IFF_ATC_NAVAIDS_FundamentalParameterData::GetAsString() const
{
    KStringStream ss;

    ss << "IFF/ATC/NAVAID Fundamental Parameter Data:"
       << "\n\tERP:              " << m_f32ERP
       << "\n\tFrequency:        " << m_f32Freq
       << "\n\tPgRF:             " << m_f32PgRF
       << "\n\tPulse Width:      " << m_f32PulseWidth
       << "\n\tBurst Length:     " << m_ui32BurstLength
       << "\n\tApplicable Modes: " << GetEnumAsStringSystemMode( m_ui8AppMode )
       << "\n";

    return ss.str();
}